

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

void learn(stagewise_poly *poly,single_learner *base,example *ec)

{
  float fVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  
  bVar2 = poly->all->training;
  fVar1 = (ec->l).simple.label;
  poly->original_ec = ec;
  if ((bVar2 != true) || ((fVar1 == 3.4028235e+38 && (!NAN(fVar1))))) {
    predict(poly,base,ec);
    return;
  }
  if (poly->update_support == true) {
    sort_data_update_support(poly);
    poly->update_support = false;
  }
  synthetic_create(poly,ec,true);
  LEARNER::learner<char,_example>::learn(base,&poly->synth_ec,0);
  ec->partial_prediction = (poly->synth_ec).partial_prediction;
  ec->updated_prediction = (poly->synth_ec).updated_prediction;
  (ec->pred).scalar = (poly->synth_ec).pred.scalar;
  uVar3 = ec->example_counter;
  if (((uVar3 != 0) && (poly->last_example_counter != uVar3)) && ((ulong)poly->batch_sz != 0)) {
    if (poly->batch_sz_double == true) {
      uVar4 = poly->next_batch_sz;
      if (uVar3 % (ulong)uVar4 != 0) goto LAB_001ab5de;
    }
    else {
      if (uVar3 % (ulong)poly->batch_sz != 0) goto LAB_001ab5de;
      uVar4 = poly->next_batch_sz;
    }
    poly->next_batch_sz = uVar4 * 2;
    poly->update_support = poly->numpasses == 1 || poly->all->all_reduce == (AllReduce *)0x0;
    uVar3 = ec->example_counter;
  }
LAB_001ab5de:
  poly->last_example_counter = uVar3;
  return;
}

Assistant:

void learn(stagewise_poly &poly, single_learner &base, example &ec)
{
  bool training = poly.all->training && ec.l.simple.label != FLT_MAX;
  poly.original_ec = &ec;

  if (training)
  {
    if (poly.update_support)
    {
      sort_data_update_support(poly);
      poly.update_support = false;
    }

    synthetic_create(poly, ec, training);
    base.learn(poly.synth_ec);
    ec.partial_prediction = poly.synth_ec.partial_prediction;
    ec.updated_prediction = poly.synth_ec.updated_prediction;
    ec.pred.scalar = poly.synth_ec.pred.scalar;

    if (ec.example_counter
        // following line is to avoid repeats when multiple reductions on same example.
        // XXX ideally, would get all "copies" of an example before scheduling the support
        // update, but how do we know?
        && poly.last_example_counter != ec.example_counter && poly.batch_sz &&
        ((poly.batch_sz_double && !(ec.example_counter % poly.next_batch_sz)) ||
            (!poly.batch_sz_double && !(ec.example_counter % poly.batch_sz))))
    {
      poly.next_batch_sz *= 2;  // no effect when !poly.batch_sz_double
      poly.update_support = (poly.all->all_reduce == nullptr || poly.numpasses == 1);
    }
    poly.last_example_counter = ec.example_counter;
  }
  else
    predict(poly, base, ec);
}